

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateString(Tables *this,string *value)

{
  string *this_00;
  string *result;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)value);
  result = this_00;
  std::
  vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
  ::emplace_back<std::__cxx11::string*&>
            ((vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
              *)&this->strings_,&result);
  return result;
}

Assistant:

std::string* DescriptorPool::Tables::AllocateString(const std::string& value) {
  std::string* result = new std::string(value);
  strings_.emplace_back(result);
  return result;
}